

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::enforceNoUsedTokens(Session *this)

{
  bool bVar1;
  runtime_error *this_00;
  string local_b0 [48];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  string local_40 [8];
  string msg;
  __normal_iterator<const_Clara::Parser::Token_*,_std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>_>
  local_20;
  const_iterator itEnd;
  const_iterator it;
  Session *this_local;
  
  bVar1 = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::empty
                    (&this->m_unusedTokens);
  if (!bVar1) {
    itEnd = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::begin
                      (&this->m_unusedTokens);
    local_20._M_current =
         (Token *)std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::end
                            (&this->m_unusedTokens);
    std::__cxx11::string::string(local_40);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&itEnd,&local_20);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Clara::Parser::Token_*,_std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>_>
      ::operator->(&itEnd);
      std::operator+((char *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "  unrecognised option: ");
      std::operator+(local_60,(char *)local_80);
      std::__cxx11::string::operator+=(local_40,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string(local_80);
      __gnu_cxx::
      __normal_iterator<const_Clara::Parser::Token_*,_std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>_>
      ::operator++(&itEnd);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_40);
    std::runtime_error::runtime_error(this_00,local_b0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void enforceNoUsedTokens() const {
            if( !m_unusedTokens.empty() ) {
                std::vector<Clara::Parser::Token>::const_iterator
                    it = m_unusedTokens.begin(),
                    itEnd = m_unusedTokens.end();
                std::string msg;
                for(; it != itEnd; ++it )
                    msg += "  unrecognised option: " + it->data + "\n";
                throw std::runtime_error( msg.substr( 0, msg.size()-1 ) );
            }
        }